

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O1

void regul1(qnode_ptr_t f,int n,int sf,float trsh)

{
  int iVar1;
  int iVar2;
  pos_t pVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int i;
  bool bVar7;
  undefined4 in_XMM0_Db;
  disp_vect_t u;
  float det;
  float cn;
  int num;
  pos_t sample [316];
  int local_a24;
  double local_a20;
  pos_t local_a18 [317];
  
  iVar6 = f->ofst * 2 + 4;
  iVar5 = (int)((double)(((f->sizx - iVar6) + -4) % n) * 0.5 + 0.5);
  iVar1 = (int)((double)(((f->sizy - iVar6) + -4) % n) * 0.5 + 0.5);
  KERNEL_X = KERNEL_X + iVar5;
  KERNEL_Y = KERNEL_Y + iVar1;
  i = f->ofst + iVar1 + 4;
  iVar6 = f->ofst;
  if (i < (f->sizy + (-4 - iVar1)) - iVar6) {
    local_a20 = (double)(float)(double)CONCAT44(in_XMM0_Db,trsh);
    do {
      for (iVar6 = iVar6 + iVar5 + 4; iVar6 < (f->sizx + (-4 - iVar5)) - f->ofst; iVar6 = iVar6 + n)
      {
        min_discr(f,i,iVar6,n,local_a18,&local_a24);
        pVar3 = min_cond(local_a18,f,n,local_a24,SUB84(local_a20,0),sf);
        iVar2 = pVar3.i;
        bVar7 = (ulong)pVar3 >> 0x20 != 0xffffffff;
        u.x = -100.0;
        u.y = 100.0;
        iVar4 = pVar3.j;
        if (bVar7 && iVar2 != -1) {
          u = (*f->flow_ptr)[f->res * iVar2 + iVar4];
        }
        det = 0.0;
        cn = 0.0;
        if (bVar7 && iVar2 != -1) {
          cn = SUB84((double)(*f->param_ptr[f->sizz / 2])[f->res * iVar2 + iVar4].cond,0);
          det = SUB84((double)(*f->param_ptr[f->sizz / 2])[f->res * iVar2 + iVar4].gauss,0);
        }
        propagate(u,det,cn,f,i,iVar6,n);
      }
      i = i + n;
      iVar6 = f->ofst;
    } while (i < (f->sizy + (-4 - iVar1)) - iVar6);
  }
  return;
}

Assistant:

void regul1(f,n,sf,trsh)
qnode_ptr_t f ;
int n, sf ;
float trsh ;

{ pos_t min_cond(), sample[X], rep_loc ;
  disp_vect_t vector(), u ;
  float condition(), determinant(), cond_num, det ;
  int num, xf, yf, i, j, k ;

  xf = (int)(((f->sizx-f->ofst-NRADIUS-(f->ofst+NRADIUS))%n)/2.0 + 0.5) ;
  yf = (int)(((f->sizy-f->ofst-NRADIUS-(f->ofst+NRADIUS))%n)/2.0 + 0.5) ;
  KERNEL_X += xf ;
  KERNEL_Y += yf ;

  for (i = f->ofst+NRADIUS+yf ; i < f->sizy-f->ofst-NRADIUS-yf ; i += n) {
    for (j = f->ofst+NRADIUS+xf ; j < f->sizx-f->ofst-NRADIUS-xf ; j += n) {
      min_discr(f,i,j,n,sample,&num) ;
      rep_loc = min_cond(sample,f,n,num,trsh,sf) ;
      u = vector(rep_loc,f) ;
      cond_num = condition(rep_loc,f) ;
      det = determinant(rep_loc,f) ;
      propagate(u,det,cond_num,f,i,j,n) ;
    }
  }
}